

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O2

void __thiscall
helics::apps::Echo::addEndpoint(Echo *this,string_view endpointName,string_view endpointType)

{
  Endpoint *__args;
  _Elt_pointer pEVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  __args = helics::MessageFederate::registerGlobalEndpoint
                     ((MessageFederate *)
                      &(((this->super_App).fed.
                         super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ValueFederate).field_0x10,(string_view)endpointName,
                      (string_view)endpointType);
  std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
            ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,__args);
  pEVar1 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar1 == (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pEVar1 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  local_30._8_8_ = 0;
  local_18 = CLI::std::
             _Function_handler<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Echo.cpp:134:13)>
             ::_M_invoke;
  local_20 = CLI::std::
             _Function_handler<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Echo.cpp:134:13)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  Endpoint::setCallback
            (pEVar1 + -1,
             (function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
             &local_30);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

void Echo::addEndpoint(std::string_view endpointName, std::string_view endpointType)
    {
        endpoints.emplace_back(fed->registerGlobalEndpoint(endpointName, endpointType));
        endpoints.back().setCallback(
            [this](const Endpoint& ept, Time messageTime) { echoMessage(ept, messageTime); });
    }